

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

cmListFileContext *
cmConditionEvaluator::GetConditionContext
          (cmListFileContext *__return_storage_ptr__,cmMakefile *mf,cmCommandContext *command,
          string *filePath)

{
  Snapshot snapshot;
  bool bVar1;
  cmake *this;
  undefined8 local_70;
  undefined8 uStack_68;
  PositionType local_60;
  string local_58;
  cmOutputConverter converter;
  
  cmListFileContext::FromCommandContext(__return_storage_ptr__,command,filePath);
  this = cmMakefile::GetCMakeInstance(mf);
  bVar1 = cmake::GetIsInTryCompile(this);
  if (!bVar1) {
    cmMakefile::GetStateSnapshot(mf);
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_68;
    snapshot.State = (cmState *)local_70;
    snapshot.Position.Position = local_60;
    cmOutputConverter::cmOutputConverter(&converter,snapshot);
    cmOutputConverter::Convert
              (&local_58,&converter,&__return_storage_ptr__->FilePath,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)&local_58)
    ;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmConditionEvaluator::GetConditionContext(
    cmMakefile* mf,
    const cmCommandContext& command,
    const std::string& filePath)
{
  cmListFileContext context =
      cmListFileContext::FromCommandContext(
        command,
        filePath);

  if(!mf->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(mf->GetStateSnapshot());
    context.FilePath = converter.Convert(context.FilePath,
                                         cmOutputConverter::HOME);
    }
  return context;
}